

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O0

void __thiscall QGridLayoutRowInfo::insertOrRemoveRows(QGridLayoutRowInfo *this,int row,int delta)

{
  int in_EDX;
  int *in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  QList<QGridLayoutBox> *in_stack_00000028;
  
  *in_RDI = in_EDX + *in_RDI;
  insertOrRemoveItems<QStretchParameter>
            ((QList<QStretchParameter> *)in_stack_00000028,in_stack_00000024,in_stack_00000020);
  insertOrRemoveItems<QLayoutParameter<double>>
            ((QList<QLayoutParameter<double>_> *)CONCAT44(in_stack_00000024,in_stack_00000020),
             in_stack_0000001c,in_stack_00000018);
  insertOrRemoveItems<QFlags<Qt::AlignmentFlag>>
            ((QList<QFlags<Qt::AlignmentFlag>_> *)in_stack_00000028,in_stack_00000024,
             in_stack_00000020);
  insertOrRemoveItems<QGridLayoutBox>(in_stack_00000028,in_stack_00000024,in_stack_00000020);
  return;
}

Assistant:

void QGridLayoutRowInfo::insertOrRemoveRows(int row, int delta)
{
    count += delta;

    insertOrRemoveItems(stretches, row, delta);
    insertOrRemoveItems(spacings, row, delta);
    insertOrRemoveItems(alignments, row, delta);
    insertOrRemoveItems(boxes, row, delta);
}